

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

ptr<FakeClient> __thiscall nuraft::FakeNetwork::findClient(FakeNetwork *this,string *endpoint)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<FakeClient> pVar2;
  iterator entry;
  lock_guard<std::mutex> ll;
  element_type *this_00;
  _Self local_40 [3];
  _Self local_28 [5];
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_RDI);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
               *)in_RDI,(key_type *)0x14089d);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
              *)in_RDI);
  bVar1 = std::operator==(local_28,local_40);
  if (bVar1) {
    std::shared_ptr<nuraft::FakeClient>::shared_ptr
              ((shared_ptr<nuraft::FakeClient> *)this_00,in_RDI);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>
                  *)0x140911);
    std::shared_ptr<nuraft::FakeClient>::shared_ptr
              ((shared_ptr<nuraft::FakeClient> *)this_00,(shared_ptr<nuraft::FakeClient> *)in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x140933);
  pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (ptr<FakeClient>)pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<FakeClient> FakeNetwork::findClient(const std::string& endpoint) {
    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry == clients.end()) return nullptr;
    return entry->second;
}